

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O0

int bam_str2flag(char *str)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  long flag;
  char *beg;
  char *end;
  char *str_local;
  
  end = str;
  lVar3 = strtol(str,&beg,0);
  if (beg == end) {
    uVar2 = 0;
    flag = (long)str;
    while (str_local._4_4_ = uVar2, *end != '\0') {
      beg = (char *)flag;
      while( true ) {
        bVar4 = false;
        if (*beg != '\0') {
          bVar4 = *beg != ',';
        }
        if (!bVar4) break;
        beg = beg + 1;
      }
      iVar1 = strncasecmp("PAIRED",(char *)flag,(long)beg - flag);
      if ((iVar1 == 0) && ((long)beg - flag == 6)) {
        uVar2 = uVar2 | 1;
      }
      else {
        iVar1 = strncasecmp("PROPER_PAIR",(char *)flag,(long)beg - flag);
        if ((iVar1 == 0) && ((long)beg - flag == 0xb)) {
          uVar2 = uVar2 | 2;
        }
        else {
          iVar1 = strncasecmp("UNMAP",(char *)flag,(long)beg - flag);
          if ((iVar1 == 0) && ((long)beg - flag == 5)) {
            uVar2 = uVar2 | 4;
          }
          else {
            iVar1 = strncasecmp("MUNMAP",(char *)flag,(long)beg - flag);
            if ((iVar1 == 0) && ((long)beg - flag == 6)) {
              uVar2 = uVar2 | 8;
            }
            else {
              iVar1 = strncasecmp("REVERSE",(char *)flag,(long)beg - flag);
              if ((iVar1 == 0) && ((long)beg - flag == 7)) {
                uVar2 = uVar2 | 0x10;
              }
              else {
                iVar1 = strncasecmp("MREVERSE",(char *)flag,(long)beg - flag);
                if ((iVar1 == 0) && ((long)beg - flag == 8)) {
                  uVar2 = uVar2 | 0x20;
                }
                else {
                  iVar1 = strncasecmp("READ1",(char *)flag,(long)beg - flag);
                  if ((iVar1 == 0) && ((long)beg - flag == 5)) {
                    uVar2 = uVar2 | 0x40;
                  }
                  else {
                    iVar1 = strncasecmp("READ2",(char *)flag,(long)beg - flag);
                    if ((iVar1 == 0) && ((long)beg - flag == 5)) {
                      uVar2 = uVar2 | 0x80;
                    }
                    else {
                      iVar1 = strncasecmp("SECONDARY",(char *)flag,(long)beg - flag);
                      if ((iVar1 == 0) && ((long)beg - flag == 9)) {
                        uVar2 = uVar2 | 0x100;
                      }
                      else {
                        iVar1 = strncasecmp("QCFAIL",(char *)flag,(long)beg - flag);
                        if ((iVar1 == 0) && ((long)beg - flag == 6)) {
                          uVar2 = uVar2 | 0x200;
                        }
                        else {
                          iVar1 = strncasecmp("DUP",(char *)flag,(long)beg - flag);
                          if ((iVar1 == 0) && ((long)beg - flag == 3)) {
                            uVar2 = uVar2 | 0x400;
                          }
                          else {
                            iVar1 = strncasecmp("SUPPLEMENTARY",(char *)flag,(long)beg - flag);
                            if ((iVar1 != 0) || ((long)beg - flag != 0xd)) {
                              return -1;
                            }
                            uVar2 = uVar2 | 0x800;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (*beg == '\0') {
        return uVar2;
      }
      flag = (long)(beg + 1);
    }
  }
  else {
    str_local._4_4_ = (uint)lVar3;
  }
  return str_local._4_4_;
}

Assistant:

int bam_str2flag(const char *str)
{
    char *end, *beg = (char*) str;
    long int flag = strtol(str, &end, 0);
    if ( end!=str ) return flag;    // the conversion was successful
    flag = 0;
    while ( *str )
    {
        end = beg;
        while ( *end && *end!=',' ) end++;
        if ( !STRNCMP("PAIRED",beg,end-beg) ) flag |= BAM_FPAIRED;
        else if ( !STRNCMP("PROPER_PAIR",beg,end-beg) ) flag |= BAM_FPROPER_PAIR;
        else if ( !STRNCMP("UNMAP",beg,end-beg) ) flag |= BAM_FUNMAP;
        else if ( !STRNCMP("MUNMAP",beg,end-beg) ) flag |= BAM_FMUNMAP;
        else if ( !STRNCMP("REVERSE",beg,end-beg) ) flag |= BAM_FREVERSE;
        else if ( !STRNCMP("MREVERSE",beg,end-beg) ) flag |= BAM_FMREVERSE;
        else if ( !STRNCMP("READ1",beg,end-beg) ) flag |= BAM_FREAD1;
        else if ( !STRNCMP("READ2",beg,end-beg) ) flag |= BAM_FREAD2;
        else if ( !STRNCMP("SECONDARY",beg,end-beg) ) flag |= BAM_FSECONDARY;
        else if ( !STRNCMP("QCFAIL",beg,end-beg) ) flag |= BAM_FQCFAIL;
        else if ( !STRNCMP("DUP",beg,end-beg) ) flag |= BAM_FDUP;
        else if ( !STRNCMP("SUPPLEMENTARY",beg,end-beg) ) flag |= BAM_FSUPPLEMENTARY;
        else return -1;
        if ( !*end ) break;
        beg = end + 1;
    }
    return flag;
}